

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::Clara::Detail::TokenStream::loadBuffer(TokenStream *this)

{
  vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> *this_00;
  pointer *ppTVar1;
  pointer pTVar2;
  StringRef *pSVar3;
  ulong uVar4;
  iterator iVar5;
  StringRef *pSVar6;
  StringRef *pSVar7;
  StringRef *pSVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  Token local_48;
  
  pTVar2 = (this->m_tokenBuffer).
           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_tokenBuffer).
      super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
      _M_impl.super__Vector_impl_data._M_finish != pTVar2) {
    (this->m_tokenBuffer).
    super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
    _M_impl.super__Vector_impl_data._M_finish = pTVar2;
  }
  pSVar8 = (this->it)._M_current;
  pSVar3 = (this->itEnd)._M_current;
  bVar13 = pSVar8 == pSVar3;
  if (!bVar13) {
    pSVar6 = pSVar8;
    if (pSVar8->m_size == 0) {
      do {
        pSVar8 = pSVar6 + 1;
        bVar13 = pSVar8 == pSVar3;
        if (bVar13) {
          (this->it)._M_current = pSVar8;
          return;
        }
        pSVar7 = pSVar6 + 1;
        pSVar6 = pSVar8;
      } while (pSVar7->m_size == 0);
      (this->it)._M_current = pSVar8;
    }
    if (!bVar13) {
      this_00 = &this->m_tokenBuffer;
      pcVar10 = pSVar8->m_start;
      uVar4 = pSVar8->m_size;
      local_48.token.m_size = uVar4;
      local_48.token.m_start = pcVar10;
      if (*pcVar10 == '-') {
        if (uVar4 != 0) {
          uVar12 = 0;
          do {
            if (((ulong)(byte)pcVar10[uVar12] < 0x3e) &&
               ((0x2400000100000000U >> ((ulong)(byte)pcVar10[uVar12] & 0x3f) & 1) != 0))
            goto LAB_00143225;
            uVar12 = uVar12 + 1;
          } while (uVar4 != uVar12);
        }
        uVar12 = 0xffffffffffffffff;
LAB_00143225:
        if (uVar12 == 0xffffffffffffffff) {
          if (2 < uVar4 && pcVar10[1] != '-') {
            lVar11 = uVar4 - 1;
            do {
              pcVar10 = pcVar10 + 1;
              local_48.type = Option;
              local_48.token.m_size = 1;
              iVar5._M_current =
                   (this->m_tokenBuffer).
                   super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar5._M_current ==
                  (this->m_tokenBuffer).
                  super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                local_48.token.m_start = pcVar10;
                std::
                vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
                _M_realloc_insert<Catch::Clara::Detail::Token>(this_00,iVar5,&local_48);
              }
              else {
                ((iVar5._M_current)->token).m_size = 1;
                *(ulong *)iVar5._M_current = (ulong)(uint)local_48._4_4_ << 0x20;
                ((iVar5._M_current)->token).m_start = pcVar10;
                ppTVar1 = &(this->m_tokenBuffer).
                           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppTVar1 = *ppTVar1 + 1;
              }
              lVar11 = lVar11 + -1;
            } while (lVar11 != 0);
            return;
          }
          local_48.type = Option;
        }
        else {
          local_48.token.m_size = uVar12;
          if (uVar4 < uVar12) {
            local_48.token.m_size = uVar4;
          }
          if (uVar4 == 0) {
            local_48.token.m_start = "";
          }
          local_48.type = Option;
          if (uVar4 == 0) {
            local_48.token.m_size = uVar4;
          }
          iVar5._M_current =
               (this->m_tokenBuffer).
               super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->m_tokenBuffer).
              super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
            _M_realloc_insert<Catch::Clara::Detail::Token>(this_00,iVar5,&local_48);
          }
          else {
            ((iVar5._M_current)->token).m_size = local_48.token.m_size;
            *(ulong *)iVar5._M_current = (ulong)(uint)local_48._4_4_ << 0x20;
            ((iVar5._M_current)->token).m_start = local_48.token.m_start;
            ppTVar1 = &(this->m_tokenBuffer).
                       super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppTVar1 = *ppTVar1 + 1;
          }
          uVar9 = uVar4 - (uVar12 + 1);
          if (uVar4 <= uVar9) {
            uVar9 = uVar4;
          }
          local_48.type = Argument;
          local_48.token.m_start = "";
          local_48.token.m_size = 0;
          if (uVar12 + 1 < uVar4) {
            local_48.token.m_start = pcVar10 + uVar12 + 1;
            local_48.token.m_size = uVar9;
          }
        }
      }
      else {
        local_48.type = Argument;
      }
      iVar5._M_current =
           (this->m_tokenBuffer).
           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->m_tokenBuffer).
          super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
        _M_realloc_insert<Catch::Clara::Detail::Token>(this_00,iVar5,&local_48);
      }
      else {
        ((iVar5._M_current)->token).m_size = local_48.token.m_size;
        *(ulong *)iVar5._M_current = CONCAT44(local_48._4_4_,local_48.type);
        ((iVar5._M_current)->token).m_start = local_48.token.m_start;
        ppTVar1 = &(this->m_tokenBuffer).
                   super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppTVar1 = *ppTVar1 + 1;
      }
    }
  }
  return;
}

Assistant:

void TokenStream::loadBuffer() {
                m_tokenBuffer.clear();

                // Skip any empty strings
                while ( it != itEnd && it->empty() ) {
                    ++it;
                }

                if ( it != itEnd ) {
                    StringRef next = *it;
                    if ( isOptPrefix( next[0] ) ) {
                        auto delimiterPos = find_first_separator(next);
                        if ( delimiterPos != StringRef::npos ) {
                            m_tokenBuffer.push_back(
                                { TokenType::Option,
                                  next.substr( 0, delimiterPos ) } );
                            m_tokenBuffer.push_back(
                                { TokenType::Argument,
                                  next.substr( delimiterPos + 1, next.size() ) } );
                        } else {
                            if ( next[1] != '-' && next.size() > 2 ) {
                                // Combined short args, e.g. "-ab" for "-a -b"
                                for ( size_t i = 1; i < next.size(); ++i ) {
                                    m_tokenBuffer.push_back(
                                        { TokenType::Option,
                                          next.substr( i, 1 ) } );
                                }
                            } else {
                                m_tokenBuffer.push_back(
                                    { TokenType::Option, next } );
                            }
                        }
                    } else {
                        m_tokenBuffer.push_back(
                            { TokenType::Argument, next } );
                    }
                }
            }